

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MapDrive.cpp
# Opt level: O3

float __thiscall anon_unknown.dwarf_5c268::MapDriver::maxSpeedForCurvature(MapDriver *this)

{
  PolylineSegmentedPathwaySegmentRadii *pathway;
  uint uVar1;
  float fVar2;
  float extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  float extraout_XMM0_Db;
  float fVar3;
  Vec3 VVar4;
  float local_38;
  float fStack_34;
  Vec3 local_20;
  
  if (this->curvedSteering == true) {
    fVar2 = ABS((this->super_SimpleVehicle)._curvature) / 0.2;
    fVar3 = 1.0;
    if (fVar2 <= 1.0) {
      fVar3 = fVar2;
    }
    fVar2 = SQRT(fVar3) * -0.9 + 1.0;
    this->annoteMaxRelSpeedCurve = fVar2;
    fVar3 = fVar2;
    if ((anonymous_namespace)::MapDriver::demoSelect == 2) {
      pathway = this->path;
      local_20.z = 1.0;
      (*(this->super_SimpleVehicle).super_SimpleVehicle_3.
        super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>.
        super_LocalSpaceMixin<OpenSteer::AbstractVehicle>.super_AbstractVehicle.
        super_AbstractLocalSpace._vptr_AbstractLocalSpace[8])(this);
      VVar4 = mapPointAndDirectionToTangent(pathway,&local_20,this->pathFollowDirection);
      fVar3 = VVar4.z;
      (*(this->super_SimpleVehicle).super_SimpleVehicle_3.
        super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>.
        super_LocalSpaceMixin<OpenSteer::AbstractVehicle>.super_AbstractVehicle.
        super_AbstractLocalSpace._vptr_AbstractLocalSpace[6])(this);
      local_38 = VVar4.x;
      fStack_34 = VVar4.y;
      fVar3 = fVar3 * VVar4.z + local_38 * extraout_XMM0_Da + fStack_34 * extraout_XMM0_Db;
      uVar1 = -(uint)(fVar3 < 0.0);
      fVar3 = (float)(uVar1 & 0x3e4ccccd | ~uVar1 & (uint)(fVar3 * 0.8 + 0.2));
      this->annoteMaxRelSpeedPath = fVar3;
      if (fVar2 <= fVar3) {
        fVar3 = fVar2;
      }
    }
  }
  else {
    fVar3 = 1.0;
  }
  this->annoteMaxRelSpeed = fVar3;
  (*(this->super_SimpleVehicle).super_SimpleVehicle_3.
    super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>.
    super_LocalSpaceMixin<OpenSteer::AbstractVehicle>.super_AbstractVehicle.super_AbstractLocalSpace
    ._vptr_AbstractLocalSpace[0x20])(this);
  return extraout_XMM0_Da_00 * fVar3;
}

Assistant:

float maxSpeedForCurvature ()
        {
            float maxRelativeSpeed = 1;

            if (curvedSteering)
            {
                // compute an ad hoc "relative curvature"
                const float absC = absXXX (curvature ());
                const float maxC = 1 / minimumTurningRadius ();
                const float relativeCurvature = sqrtXXX (clip (absC/maxC, 0, 1));

                // map from full throttle when straight to 10% at max curvature
                const float curveSpeed = interpolate (relativeCurvature,1.0f,0.1f);
                annoteMaxRelSpeedCurve = curveSpeed;

                if (demoSelect != 2)
                {
                    maxRelativeSpeed = curveSpeed;
                }
                else
                {
                    // heading (unit tangent) of the path segment of interest
                    const Vec3 pathHeading =  mapPointAndDirectionToTangent( *path, position(), pathFollowDirection ); // path->tangentAt (position (), pathFollowDirection);
                    // measure how parallel we are to the path
                    const float parallelness = pathHeading.dot (forward ());

                    // determine relative speed for this heading
                    const float mw = 0.2f;
                    const float headingSpeed = ((parallelness < 0) ? mw :
                                                interpolate (parallelness,
                                                             mw, 1.0f));
                    maxRelativeSpeed = minXXX (curveSpeed, headingSpeed);
                    annoteMaxRelSpeedPath = headingSpeed;
                }
            }
            annoteMaxRelSpeed = maxRelativeSpeed;
            return maxSpeed () * maxRelativeSpeed;
        }